

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

CartesianSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (CartesianSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos)

{
  undefined8 *puVar1;
  type tVar2;
  undefined8 uVar3;
  type tVar4;
  long lVar5;
  CartesianSpeakerPosition *pCVar6;
  double *pdVar7;
  CartesianSpeakerPosition *pCVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  undefined1 local_168 [8];
  dummy_u local_160;
  bool local_140;
  dummy_u local_138;
  tuple<double,_double,_double> local_118;
  undefined1 local_100 [128];
  dummy_u local_80;
  bool local_60;
  dummy_u local_58;
  Vector3d local_38;
  
  bVar11 = 0;
  pCVar6 = pos;
  pdVar7 = (double *)local_100;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = pCVar6->X;
    pCVar6 = (CartesianSpeakerPosition *)&pCVar6->XMin;
    pdVar7 = pdVar7 + 1;
  }
  local_100[0x78] = false;
  bVar9 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar9) {
    local_80.aligner_ = (type)((long)local_100 + 0x90);
    tVar2 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_100 + 0x80),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_60 = false;
  bVar10 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_100[0x78] = bVar9;
  if (bVar10) {
    local_58.aligner_ = (type)((long)local_100 + 0xb8);
    tVar2 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_100 + 0xa8),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_60 = bVar10;
  toCartesianVector3d((CartesianSpeakerPosition *)local_100);
  local_168[0] = false;
  bVar9 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar9) {
    local_160.aligner_ = (type)((long)local_168 + 0x18);
    tVar2 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_168 + 8),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_140 = false;
  bVar10 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_168[0] = bVar9;
  if (bVar10) {
    local_138.aligner_ = (type)((long)local_168 + 0x40);
    tVar2 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_168 + 0x30),tVar2,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar2);
  }
  local_140 = bVar10;
  ScreenEdgeLockHandler::handleVector
            (&local_118,&this->_screenEdgeLockHandler,&local_38,(ScreenEdgeLock *)local_168);
  pos->X = local_118.super__Tuple_impl<0UL,_double,_double,_double>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
  pos->Y = local_118.super__Tuple_impl<0UL,_double,_double,_double>.
           super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl;
  pos->Z = (double)local_118.super__Tuple_impl<0UL,_double,_double,_double>.
                   super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                   super__Head_base<2UL,_double,_false>._M_head_impl;
  if (local_140 == true) {
    if (local_138.aligner_ != (type)((long)local_168 + 0x40)) {
      operator_delete((void *)local_138.aligner_,local_138._16_8_ + 1);
    }
    local_140 = false;
  }
  if (local_168[0] == true) {
    if (local_160.aligner_ != (type)((long)local_168 + 0x18)) {
      operator_delete((void *)local_160.aligner_,local_160._16_8_ + 1);
    }
    local_168[0] = false;
  }
  if (local_60 == true) {
    if (local_58.aligner_ != (type)((long)local_100 + 0xb8)) {
      operator_delete((void *)local_58.aligner_,local_58._16_8_ + 1);
    }
    local_60 = false;
  }
  if ((local_100[0x78] == true) && (local_80.aligner_ != (type)((long)local_100 + 0x90))) {
    operator_delete((void *)local_80.aligner_,local_80._16_8_ + 1);
  }
  pCVar6 = pos;
  pCVar8 = __return_storage_ptr__;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    pCVar8->X = pCVar6->X;
    pCVar6 = (CartesianSpeakerPosition *)((long)pCVar6 + (ulong)bVar11 * -0x10 + 8);
    pCVar8 = (CartesianSpeakerPosition *)((long)pCVar8 + (ulong)bVar11 * -0x10 + 8);
  }
  (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_initialized = false;
  if ((pos->screenEdgeLock).horizontal.super_type.m_initialized == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_
             + 0x10);
    *(undefined8 **)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_
         = puVar1;
    tVar2 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    tVar4 = (type)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 == tVar4) {
      uVar3 = *(undefined8 *)
               ((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar4;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ +
       0x18) = uVar3;
    }
    else {
      (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_ =
           tVar2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ +
       0x10) = *(undefined8 *)tVar4;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8);
    *(type *)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ = tVar4;
    *(undefined8 *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) = 0;
    (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.data[0x10] = '\0';
    (__return_storage_ptr__->screenEdgeLock).horizontal.super_type.m_initialized = true;
  }
  (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_initialized = false;
  if ((pos->screenEdgeLock).vertical.super_type.m_initialized == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ +
             0x10);
    *(undefined8 **)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ =
         puVar1;
    tVar2 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    tVar4 = (type)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 == tVar4) {
      uVar3 = *(undefined8 *)
               ((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar4;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x18)
           = uVar3;
    }
    else {
      (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_ = tVar2
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10)
           = *(undefined8 *)tVar4;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8);
    *(type *)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ = tVar4;
    *(undefined8 *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) = 0;
    (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.data[0x10] = '\0';
    (__return_storage_ptr__->screenEdgeLock).vertical.super_type.m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

CartesianSpeakerPosition
  GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      CartesianSpeakerPosition pos) {
    std::tie(pos.X, pos.Y, pos.Z) = _screenEdgeLockHandler.handleVector(
        toCartesianVector3d(pos), pos.screenEdgeLock);
    return pos;
  }